

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_accessor_2.cpp
# Opt level: O0

void __thiscall UDPSplitPacketReader::SplitPacket::SplitPacket(SplitPacket *this,int size)

{
  int size_local;
  SplitPacket *this_local;
  
  Reader::Reader((Reader *)&this->field_0x48);
  BufferReader::BufferReader(&this->super_BufferReader,&PTR_construction_vtable_24__00133c50,size);
  (this->super_BufferReader).super_Buffer._vptr_Buffer = (_func_int **)0x133c08;
  *(undefined8 *)&this->field_0x48 = 0x133c40;
  std::_List_iterator<UDPSplitPacketReader::SplitPacket>::_List_iterator
            ((_List_iterator<UDPSplitPacketReader::SplitPacket> *)
             &(this->super_BufferReader).field_0x28);
  std::_List_iterator<UDPSplitPacketReader::SplitPacket>::_List_iterator(&this->previous);
  std::_List_iterator<UDPSplitPacketReader::SplitPacket>::_List_iterator(&this->start);
  this->hasEnd = false;
  this->hasStart = false;
  this->hasPrevious = false;
  this->hasNext = false;
  return;
}

Assistant:

UDPSplitPacketReader::SplitPacket::SplitPacket(int size) : BufferReader(size) {
  hasNext = hasPrevious = hasStart = hasEnd = false;
}